

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O1

void __thiscall hello::csrf(hello *this)

{
  char cVar1;
  int iVar2;
  session_interface *this_00;
  csrf c;
  undefined1 *local_5f8 [2];
  undefined1 local_5e8 [16];
  undefined1 *local_5d8 [2];
  undefined1 local_5c8 [16];
  undefined **local_5b8 [2];
  undefined1 local_5a8 [8];
  text local_5a0 [648];
  submit local_318 [704];
  context local_58 [48];
  bool local_28;
  
  this_00 = (session_interface *)cppcms::application::session();
  local_5b8[0] = (undefined **)&((csrf *)local_5b8)->field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"name","");
  cppcms::session_interface::set<char[3]>(this_00,(string *)local_5b8,(char (*) [3])0x1222b8);
  if (local_5b8[0] != (undefined **)&((csrf *)local_5b8)->field_0x10) {
    operator_delete(local_5b8[0]);
  }
  view::csrf::csrf((csrf *)local_5b8);
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_((request *)local_5d8);
  iVar2 = std::__cxx11::string::compare((char *)local_5d8);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0]);
  }
  if (iVar2 == 0) {
    cppcms::application::context();
    cppcms::form::load((context *)&((csrf *)local_5b8)->my_form);
    cVar1 = cppcms::form::validate();
    if (cVar1 != '\0') {
      local_28 = true;
    }
  }
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"csrf","");
  cppcms::application::render(this,local_5f8,(csrf *)local_5b8);
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0]);
  }
  local_5b8[0] = &PTR__csrf_0012a970;
  cppcms::form::~form(&((csrf *)local_5b8)->my_form);
  cppcms::widgets::submit::~submit(&((csrf *)local_5b8)->button);
  cppcms::widgets::text::~text(&((csrf *)local_5b8)->text);
  cppcms::base_content::~base_content((base_content *)local_5b8);
  return;
}

Assistant:

void csrf()
	{
		session().set("name","me");
		view::csrf c;
		if(request().request_method() == "POST") {
			c.my_form.load(context());
			if(c.my_form.validate()) {
				c.valid=true;
			}
		}
		render("csrf",c);
	}